

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O1

Txid * __thiscall
cfd::core::AbstractTransaction::GetTxid(Txid *__return_storage_ptr__,AbstractTransaction *this)

{
  ByteData256 bytedata;
  ByteData256 local_28;
  
  GetHash(&local_28,this,false);
  Txid::Txid(__return_storage_ptr__,&local_28);
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Txid AbstractTransaction::GetTxid() const {
  ByteData256 bytedata = GetHash();
  return Txid(bytedata);
}